

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

char * sqlite3NameFromToken(sqlite3 *db,Token *pName)

{
  char *__src;
  char *z;
  ulong __n;
  
  if (pName == (Token *)0x0) {
    return (char *)0x0;
  }
  __src = pName->z;
  if (__src != (char *)0x0) {
    __n = (ulong)pName->n;
    z = (char *)sqlite3DbMallocRawNN(db,__n + 1);
    if (z != (char *)0x0) {
      memcpy(z,__src,__n);
      z[__n] = '\0';
      goto LAB_00158b03;
    }
  }
  z = (char *)0x0;
LAB_00158b03:
  sqlite3Dequote(z);
  return z;
}

Assistant:

SQLITE_PRIVATE char *sqlite3NameFromToken(sqlite3 *db, Token *pName){
  char *zName;
  if( pName ){
    zName = sqlite3DbStrNDup(db, (char*)pName->z, pName->n);
    sqlite3Dequote(zName);
  }else{
    zName = 0;
  }
  return zName;
}